

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XUtil.cpp
# Opt level: O3

DOMElement * xercesc_4_0::XUtil::getFirstChildElement(DOMNode *parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMElement *pDVar2;
  
  iVar1 = (*parent->_vptr_DOMNode[7])();
  pDVar2 = (DOMElement *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    if (pDVar2 == (DOMElement *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*(pDVar2->super_DOMNode)._vptr_DOMNode[4])(pDVar2);
    if (iVar1 == 1) break;
    iVar1 = (*(pDVar2->super_DOMNode)._vptr_DOMNode[10])(pDVar2);
    pDVar2 = (DOMElement *)CONCAT44(extraout_var_00,iVar1);
  }
  return pDVar2;
}

Assistant:

DOMElement* XUtil::getFirstChildElement(const DOMNode* const parent)
{
    // search for node
    DOMNode* child = parent->getFirstChild();

    while (child != 0)
	{
        if (child->getNodeType() == DOMNode::ELEMENT_NODE)
            return (DOMElement*)child;

        child = child->getNextSibling();
    }

    // not found
    return 0;
}